

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLDateTime.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::XMLDateTime::fillString(XMLDateTime *this,XMLCh **ptr,int value,XMLSize_t expLen)

{
  XMLCh XVar1;
  XMLCh *pXVar2;
  XMLSize_t XVar3;
  ulong local_58;
  XMLSize_t i;
  XMLSize_t actualLen;
  XMLCh strBuffer [16];
  XMLSize_t expLen_local;
  int value_local;
  XMLCh **ptr_local;
  XMLDateTime *this_local;
  
  strBuffer._24_8_ = expLen;
  if (expLen < 0x10) {
    XMLString::binToText(value,(XMLCh *)&actualLen,expLen,10,this->fMemoryManager);
    XVar3 = XMLString::stringLen((XMLCh *)&actualLen);
    for (local_58 = 0; local_58 < strBuffer._24_8_ - XVar3; local_58 = local_58 + 1) {
      pXVar2 = *ptr;
      *ptr = pXVar2 + 1;
      *pXVar2 = L'0';
    }
    for (local_58 = 0; local_58 < XVar3; local_58 = local_58 + 1) {
      XVar1 = strBuffer[local_58 - 4];
      pXVar2 = *ptr;
      *ptr = pXVar2 + 1;
      *pXVar2 = XVar1;
    }
    return;
  }
  __assert_fail("expLen < 16",
                "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/XMLDateTime.cpp"
                ,0x749,"void xercesc_4_0::XMLDateTime::fillString(XMLCh *&, int, XMLSize_t) const");
}

Assistant:

void XMLDateTime::fillString(XMLCh*& ptr, int value, XMLSize_t expLen) const
{
    XMLCh strBuffer[16];
    assert(expLen < 16);
    XMLString::binToText(value, strBuffer, expLen, 10, fMemoryManager);
    XMLSize_t actualLen = XMLString::stringLen(strBuffer);
    XMLSize_t i;
    //append leading zeros
    for (i = 0; i < expLen - actualLen; i++)
    {
        *ptr++ = chDigit_0;
    }

    for (i = 0; i < actualLen; i++)
    {
        *ptr++ = strBuffer[i];
    }

}